

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O3

int append_str(CharBuff *buff,char *c)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar3 = 1;
  if (c != (char *)0x0) {
    uVar6 = 0xffffffff;
    do {
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while (c[uVar6] != '\0');
    uVar3 = 1;
    if (uVar5 != 0) {
      iVar2 = sbuff_write(buff,*c);
      if (iVar2 == 0) {
        uVar3 = 0;
      }
      else {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          if (uVar6 == uVar4) break;
          iVar2 = sbuff_write(buff,c[uVar4]);
          uVar1 = uVar4 + 1;
        } while (iVar2 != 0);
        uVar3 = (uint)(uVar6 <= uVar4);
      }
    }
  }
  return uVar3;
}

Assistant:

int append_str(CharBuff* buff, const char *c){
    unsigned long len = str_len_(c);
    for (int i = 0; i < len; ++i) {
        if (sbuff_write(buff, c[i])  == 0)return false;
    }
    return true;
}